

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_cmap14_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  FT_Byte FVar3;
  FT_Byte FVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  byte *pbVar16;
  FT_Byte *pFVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar10;
  
  pbVar16 = table + 10;
  if (valid->limit < pbVar16) {
    ft_validator_error(valid,8);
  }
  uVar11 = *(uint *)(table + 2);
  uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  bVar1 = table[6];
  bVar2 = table[7];
  FVar3 = table[8];
  FVar4 = table[9];
  if ((9 < uVar11) && ((ulong)uVar11 <= (ulong)((long)valid->limit - (long)table))) {
    if (((uint)CONCAT11(FVar3,FVar4) | (uint)((ulong)bVar2 << 0x10) | (uint)((ulong)bVar1 << 0x18))
        <= (uVar11 - 10) / 0xb) goto LAB_002142fa;
  }
  ft_validator_error(valid,8);
LAB_002142fa:
  uVar14 = 1;
  for (uVar19 = 0;
      uVar19 != ((ulong)CONCAT11(FVar3,FVar4) | (ulong)bVar1 << 0x18 | (ulong)bVar2 << 0x10);
      uVar19 = uVar19 + 1) {
    bVar5 = *pbVar16;
    bVar6 = pbVar16[1];
    bVar7 = pbVar16[2];
    uVar9 = *(uint *)(pbVar16 + 3);
    uVar12 = *(uint *)(pbVar16 + 7);
    uVar13 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18
                    );
    uVar9 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    uVar10 = (ulong)uVar9;
    if ((uVar11 <= uVar13) || (uVar11 <= uVar9)) {
      ft_validator_error(valid,8);
    }
    uVar9 = (uint)bVar7 | (uint)bVar6 << 8 | (uint)bVar5 << 0x10;
    if (uVar9 < uVar14) {
      ft_validator_error(valid,8);
    }
    if (uVar13 != 0) {
      pFVar17 = table + uVar13 + 4;
      if (valid->limit < pFVar17) {
        ft_validator_error(valid,8);
      }
      uVar14 = *(uint *)(table + uVar13);
      uVar21 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18);
      if ((ulong)((long)valid->limit - (long)pFVar17) >> 2 < uVar21) {
        ft_validator_error(valid,8);
      }
      uVar14 = 0;
      for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
        uVar18 = (uint)table[uVar20 * 4 + uVar13 + 6] |
                 (uint)table[uVar20 * 4 + uVar13 + 5] << 8 | (uint)pFVar17[uVar20 * 4] << 0x10;
        uVar12 = table[uVar20 * 4 + uVar13 + 7] + uVar18;
        if (0x10ffff < uVar12) {
          ft_validator_error(valid,8);
        }
        if (uVar18 < uVar14) {
          ft_validator_error(valid,8);
        }
        uVar14 = uVar12 + 1;
      }
    }
    if (uVar10 != 0) {
      pFVar17 = table + uVar10 + 4;
      if (valid->limit < pFVar17) {
        ft_validator_error(valid,8);
      }
      uVar14 = *(uint *)(table + uVar10);
      uVar13 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18);
      if ((ulong)((long)valid->limit - (long)pFVar17) / 5 < uVar13) {
        ft_validator_error(valid,8);
      }
      uVar21 = 0;
      for (lVar15 = 0; uVar13 * 5 != lVar15; lVar15 = lVar15 + 5) {
        bVar5 = pFVar17[lVar15];
        bVar6 = table[lVar15 + uVar10 + 5];
        bVar7 = table[lVar15 + uVar10 + 6];
        uVar8 = *(ushort *)(table + lVar15 + uVar10 + 7);
        if (0x10 < bVar5) {
          ft_validator_error(valid,8);
        }
        uVar20 = (ulong)bVar7 | (ulong)bVar5 << 0x10 | (ulong)bVar6 << 8;
        if (uVar20 < uVar21) {
          ft_validator_error(valid,8);
        }
        if ((valid->level != FT_VALIDATE_DEFAULT) &&
           ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar8 << 8 | uVar8 >> 8))) {
          ft_validator_error(valid,0x10);
        }
        uVar21 = uVar20 + 1;
      }
    }
    pbVar16 = pbVar16 + 0xb;
    uVar14 = uVar9 + 1;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_selectors;


    if ( table + 2 + 4 + 4 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p             = table + 2;
    length        = TT_NEXT_ULONG( p );
    num_selectors = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 10 + 11 * num_selectors ? */
         length < 10                                 ||
         ( length - 10 ) / 11 < num_selectors        )
      FT_INVALID_TOO_SHORT;

    /* check selectors, they must be in increasing order */
    {
      /* we start lastVarSel at 1 because a variant selector value of 0
       * isn't valid.
       */
      FT_ULong  n, lastVarSel = 1;


      for ( n = 0; n < num_selectors; n++ )
      {
        FT_ULong  varSel    = TT_NEXT_UINT24( p );
        FT_ULong  defOff    = TT_NEXT_ULONG( p );
        FT_ULong  nondefOff = TT_NEXT_ULONG( p );


        if ( defOff >= length || nondefOff >= length )
          FT_INVALID_TOO_SHORT;

        if ( varSel < lastVarSel )
          FT_INVALID_DATA;

        lastVarSel = varSel + 1;

        /* check the default table (these glyphs should be reached     */
        /* through the normal Unicode cmap, no GIDs, just check order) */
        if ( defOff != 0 )
        {
          FT_Byte*  defp     = table + defOff;
          FT_ULong  numRanges;
          FT_ULong  i;
          FT_ULong  lastBase = 0;


          if ( defp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numRanges = TT_NEXT_ULONG( defp );

          /* defp + numRanges * 4 > valid->limit ? */
          if ( numRanges > (FT_ULong)( valid->limit - defp ) / 4 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numRanges; i++ )
          {
            FT_ULong  base = TT_NEXT_UINT24( defp );
            FT_ULong  cnt  = FT_NEXT_BYTE( defp );


            if ( base + cnt >= 0x110000UL )              /* end of Unicode */
              FT_INVALID_DATA;

            if ( base < lastBase )
              FT_INVALID_DATA;

            lastBase = base + cnt + 1U;
          }
        }

        /* and the non-default table (these glyphs are specified here) */
        if ( nondefOff != 0 )
        {
          FT_Byte*  ndp        = table + nondefOff;
          FT_ULong  numMappings;
          FT_ULong  i, lastUni = 0;


          if ( ndp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numMappings = TT_NEXT_ULONG( ndp );

          /* numMappings * 5 > (FT_ULong)( valid->limit - ndp ) ? */
          if ( numMappings > ( (FT_ULong)( valid->limit - ndp ) ) / 5 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numMappings; i++ )
          {
            FT_ULong  uni = TT_NEXT_UINT24( ndp );
            FT_ULong  gid = TT_NEXT_USHORT( ndp );


            if ( uni >= 0x110000UL )                     /* end of Unicode */
              FT_INVALID_DATA;

            if ( uni < lastUni )
              FT_INVALID_DATA;

            lastUni = uni + 1U;

            if ( valid->level >= FT_VALIDATE_TIGHT    &&
                 gid >= TT_VALID_GLYPH_COUNT( valid ) )
              FT_INVALID_GLYPH_ID;
          }
        }
      }
    }

    return FT_Err_Ok;
  }